

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

double __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::TrigFunc::precision
          (TrigFunc *this,EvalContext *ctx,double ret,double arg)

{
  ulong uVar1;
  double dVar2;
  
  if (ctx->floatPrecision == PRECISION_MEDIUMP) {
    if (3.141592653589793 < ABS(arg)) {
      uVar1 = -(ulong)(-arg <= arg);
      dVar2 = ldexp((double)(~uVar1 & (ulong)-arg | (ulong)arg & uVar1),-10);
      return dVar2;
    }
  }
  else if (ctx->floatPrecision == PRECISION_HIGHP) {
    if (3.141592653589793 < ABS(arg)) {
      uVar1 = -(ulong)(-arg <= arg);
      dVar2 = ldexp((double)(~uVar1 & (ulong)-arg | (ulong)arg & uVar1),-0xc);
      return dVar2;
    }
    dVar2 = ldexp(1.0,-0xb);
    return dVar2;
  }
  dVar2 = tcu::FloatFormat::ulp(&ctx->format,ret,2.0);
  return dVar2;
}

Assistant:

double		precision			(const EvalContext& ctx, double ret, double arg) const
	{
		if (ctx.floatPrecision == glu::PRECISION_HIGHP)
		{
			// Use precision from OpenCL fast relaxed math
			if (-DE_PI_DOUBLE <= arg && arg <= DE_PI_DOUBLE)
			{
				return deLdExp(1.0, -11);
			}
			else
			{
				// "larger otherwise", let's pick |x| * 2^-12 , which is slightly over
				// 2^-11 at x == pi.
				return deLdExp(deAbs(arg), -12);
			}
		}
		else if (ctx.floatPrecision == glu::PRECISION_MEDIUMP)
		{
			if (-DE_PI_DOUBLE <= arg && arg <= DE_PI_DOUBLE)
			{
				// from OpenCL half-float extension specification
				return ctx.format.ulp(ret, 2.0);
			}
			else
			{
				// |x| * 2^-10, slightly larger than 2 ULP at x == pi
				return deLdExp(deAbs(arg), -10);
			}
		}
		else
		{
			DE_ASSERT(ctx.floatPrecision == glu::PRECISION_LOWP);

			// from OpenCL half-float extension specification
			return ctx.format.ulp(ret, 2.0);
		}
	}